

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall Dinic_Graph2_Test::~Dinic_Graph2_Test(Dinic_Graph2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Dinic, Graph2) {
    Dinic d(5);
    vector<vector<int>> edges = {
        {1, 2, 3},
        {2, 3, 4},
        {3, 1, 2},
        {2, 2, 5},
        {3, 4, 3},
        {4, 3, 3},
    };
    for (auto &e : edges) {
        d.addEdge(e[0], e[1], e[2]);
        d.addEdge(e[1], e[0], e[2]);
    }
    
    EXPECT_EQ(5, d.getFlow(1, 4));
}